

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

int refineBySim1_left(saucy *s,coloring *c)

{
  uint uVar1;
  int *__ptr;
  int *__ptr_00;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  Vec_Int_t *randVec;
  saucy_graph *__ptr_01;
  void **ppvVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  
  if (s->pNtk->vPos->nSize != 1) {
    if (0 < NUM_SIM1_ITERATION) {
      iVar4 = 0;
      do {
        lVar5 = (long)s->pNtk->vPos->nSize;
        if (lVar5 < 1) break;
        lVar10 = 0;
        while (c->clen[lVar10] == 0) {
          lVar10 = lVar10 + 1;
          if (lVar5 == lVar10) goto LAB_0030be3f;
        }
        randVec = assignRandomBitsToCells(s->pNtk,c);
        __ptr_01 = buildSim1Graph(s->pNtk,c,randVec,s->iDep,s->oDep);
        if (__ptr_01 == (saucy_graph *)0x0) {
          __assert_fail("g != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcSaucy.c"
                        ,0x506,"int refineBySim1_left(struct saucy *, struct coloring *)");
        }
        __ptr = __ptr_01->adj;
        s->adj = __ptr;
        __ptr_00 = __ptr_01->edg;
        s->edg = __ptr_00;
        iVar9 = s->nsplits;
        if (0 < s->n) {
          iVar3 = 0;
          do {
            if (c->clen[iVar3] == 0) {
              piVar7 = s->sinduce;
              iVar8 = s->nsinduce;
              s->nsinduce = iVar8 + 1;
            }
            else {
              piVar7 = s->ninduce;
              iVar8 = s->nninduce;
              s->nninduce = iVar8 + 1;
            }
            piVar7[iVar8] = iVar3;
            s->indmark[iVar3] = '\x01';
            iVar3 = iVar3 + c->clen[iVar3] + 1;
          } while (iVar3 < s->n);
        }
        refine(s,c);
        if (iVar9 < s->nsplits) {
          pVVar2 = s->randomVectorArray_sim1;
          uVar1 = pVVar2->nCap;
          if (pVVar2->nSize == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (pVVar2->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar2->pArray,0x80);
              }
              pVVar2->pArray = ppvVar6;
              iVar4 = 0x10;
            }
            else {
              iVar4 = uVar1 * 2;
              if (iVar4 <= (int)uVar1) goto LAB_0030bd6c;
              if (pVVar2->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
              }
              pVVar2->pArray = ppvVar6;
            }
            pVVar2->nCap = iVar4;
          }
LAB_0030bd6c:
          iVar4 = pVVar2->nSize;
          pVVar2->nSize = iVar4 + 1;
          pVVar2->pArray[iVar4] = randVec;
          if (0 < s->n) {
            iVar4 = 0;
            do {
              if (c->clen[iVar4] == 0) {
                piVar7 = s->sinduce;
                iVar9 = s->nsinduce;
                s->nsinduce = iVar9 + 1;
              }
              else {
                piVar7 = s->ninduce;
                iVar9 = s->nninduce;
                s->nninduce = iVar9 + 1;
              }
              piVar7[iVar9] = iVar4;
              s->indmark[iVar4] = '\x01';
              iVar4 = iVar4 + c->clen[iVar4] + 1;
            } while (iVar4 < s->n);
          }
          s->adj = s->depAdj;
          s->edg = s->depEdg;
          refine(s,c);
          iVar4 = 1;
        }
        else {
          if (randVec->pArray != (int *)0x0) {
            free(randVec->pArray);
            randVec->pArray = (int *)0x0;
          }
          if (randVec != (Vec_Int_t *)0x0) {
            free(randVec);
          }
          iVar4 = iVar4 + 1;
        }
        if (__ptr != (int *)0x0) {
          free(__ptr);
          __ptr_01->adj = (int *)0x0;
        }
        if (__ptr_00 != (int *)0x0) {
          free(__ptr_00);
          __ptr_01->edg = (int *)0x0;
        }
        free(__ptr_01);
      } while (iVar4 < NUM_SIM1_ITERATION);
    }
LAB_0030be3f:
    s->randomVectorSplit_sim1[s->lev] = s->randomVectorArray_sim1->nSize;
  }
  return 1;
}

Assistant:

static int
refineBySim1_left(struct saucy *s, struct coloring *c) 
{
    struct saucy_graph *g;
    Vec_Int_t * randVec;
    int i, j;
    int allOutputsAreDistinguished;
    int nsplits;

    if (Abc_NtkPoNum(s->pNtk) == 1) return 1;
    
    for (i = 0; i < NUM_SIM1_ITERATION; i++) {

        /* if all outputs are distinguished, quit */
        allOutputsAreDistinguished = 1;
        for (j = 0; j < Abc_NtkPoNum(s->pNtk); j++) {
            if (c->clen[j]) {
                allOutputsAreDistinguished = 0;
                break;
            }
        }
        if (allOutputsAreDistinguished) break;

        randVec = assignRandomBitsToCells(s->pNtk, c);      
        g = buildSim1Graph(s->pNtk, c, randVec, s->iDep, s->oDep);
        assert(g != NULL);

        s->adj = g->adj;
        s->edg = g->edg;

        nsplits = s->nsplits;

        for (j = 0; j < s->n; j += c->clen[j]+1)            
                add_induce(s, c, j);
        refine(s, c);

        if (s->nsplits > nsplits) {
            /* save the random vector */
            Vec_PtrPush(s->randomVectorArray_sim1, randVec);            
            i = 0;  /* reset i */
            /* do more refinement by dependency graph */
            for (j = 0; j < s->n; j += c->clen[j]+1)                
                    add_induce(s, c, j);
            refineByDepGraph(s, c);
        }
        else
            Vec_IntFree(randVec);

        ABC_FREE( g->adj );
        ABC_FREE( g->edg );
        ABC_FREE( g );
    }

    s->randomVectorSplit_sim1[s->lev] = Vec_PtrSize(s->randomVectorArray_sim1); 

    return 1;
}